

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool basist::transcode_uastc_to_bc1(uastc_block *src_blk,void *pDst,bool high_quality)

{
  bool bVar1;
  unpacked_uastc_block unpacked_src_blk;
  color32 block_pixels [4] [4];
  
  bVar1 = unpack_uastc(src_blk,&unpacked_src_blk,false,true);
  if (bVar1) {
    if (unpacked_src_blk.m_mode == 8) {
      encode_bc1_solid_block
                (pDst,(uint)unpacked_src_blk.m_solid_color.field_0.field_0.r,
                 (uint)unpacked_src_blk.m_solid_color.field_0.field_0.g,
                 (uint)unpacked_src_blk.m_solid_color.field_0.field_0.b);
    }
    else if ((high_quality) || (unpacked_src_blk.m_bc1_hint0 != true)) {
      unpack_uastc(&unpacked_src_blk,block_pixels[0],false);
      if (unpacked_src_blk.m_bc1_hint1 == true) {
        transcode_uastc_to_bc1_hint1(&unpacked_src_blk,block_pixels,pDst,high_quality);
      }
      else {
        encode_bc1(pDst,(uint8_t *)block_pixels,(uint)high_quality);
      }
    }
    else {
      transcode_uastc_to_bc1_hint0(&unpacked_src_blk,pDst);
    }
  }
  return bVar1;
}

Assistant:

bool transcode_uastc_to_bc1(const uastc_block& src_blk, void* pDst, bool high_quality)
	{
		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			encode_bc1_solid_block(pDst, unpacked_src_blk.m_solid_color.r, unpacked_src_blk.m_solid_color.g, unpacked_src_blk.m_solid_color.b);
			return true;
		}

		if ((!high_quality) && (unpacked_src_blk.m_bc1_hint0))
			transcode_uastc_to_bc1_hint0(unpacked_src_blk, pDst);
		else
		{
			color32 block_pixels[4][4];
			const bool unpack_srgb = false;
			if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
				return false;

			if (unpacked_src_blk.m_bc1_hint1)
				transcode_uastc_to_bc1_hint1(unpacked_src_blk, block_pixels, pDst, high_quality);
			else
				encode_bc1(pDst, &block_pixels[0][0].r, high_quality ? cEncodeBC1HighQuality : 0);
		}

		return true;
	}